

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3 ConvexDecomposition::normalize(float3 *v)

{
  undefined1 auVar1 [16];
  float fVar2;
  float3 fVar3;
  
  fVar2 = v->x * v->x + v->y * v->y + v->z * v->z;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    fVar2 = auVar1._0_4_;
  }
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    puts("Cant normalize ZERO vector");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x1f6,"float3 ConvexDecomposition::normalize(const float3 &)");
  }
  fVar2 = 1.0 / fVar2;
  auVar1 = vinsertps_avx(ZEXT416((uint)(fVar2 * v->x)),ZEXT416((uint)(fVar2 * v->y)),0x10);
  fVar3._0_8_ = auVar1._0_8_;
  fVar3.z = fVar2 * v->z;
  return fVar3;
}

Assistant:

float3 normalize( const float3 &v )
{
	// this routine, normalize, is ok, provided magnitude works!!
		float d=magnitude(v);
		if (d==0)
		{
		printf("Cant normalize ZERO vector\n");
		assert(0);// yes this could go here
		d=0.1f;
	}
	d = 1/d;
	return float3(v.x*d,v.y*d,v.z*d);
}